

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

HighsStatus
calculateRowValuesQuad
          (HighsLp *lp,vector<double,_std::allocator<double>_> *col_value,
          vector<double,_std::allocator<double>_> *row_value,HighsInt report_row)

{
  int iVar1;
  pointer pdVar2;
  ulong uVar3;
  bool bVar4;
  HighsStatus HVar5;
  pointer piVar6;
  pointer pHVar7;
  pointer pdVar8;
  ulong uVar9;
  long lVar10;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> row_value_quad;
  value_type local_48;
  
  pdVar8 = (col_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (col_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = lp->num_col_;
  bVar4 = HighsSparseMatrix::isColwise(&lp->a_matrix_);
  HVar5 = kError;
  if ((bVar4) && (iVar1 == (int)((ulong)((long)pdVar8 - (long)pdVar2) >> 3))) {
    row_value_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    row_value_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    row_value_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.hi = 0.0;
    local_48.lo = 0.0;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::_M_fill_assign
              (&row_value_quad,(long)lp->num_row_,&local_48);
    uVar3 = 0;
    while (uVar9 = uVar3, (long)uVar9 < (long)lp->num_col_) {
      piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar10 = (long)piVar6[uVar9]; uVar3 = uVar9 + 1, lVar10 < piVar6[uVar9 + 1];
          lVar10 = lVar10 + 1) {
        iVar1 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        HighsCDouble::operator+=
                  (row_value_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                   _M_impl.super__Vector_impl_data._M_start + iVar1,
                   (col_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar9] *
                   (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar10]);
        if (iVar1 == report_row) {
          printf("calculateRowValuesQuad: Row %d becomes %g due to contribution of .col_value[%d] = %g\n"
                 ,row_value_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                  _M_impl.super__Vector_impl_data._M_start[iVar1].hi +
                  row_value_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                  _M_impl.super__Vector_impl_data._M_start[iVar1].lo,
                 (col_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar9],(ulong)(uint)report_row,uVar9 & 0xffffffff)
          ;
        }
        piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
    }
    std::vector<double,_std::allocator<double>_>::resize(row_value,(long)lp->num_row_);
    pdVar8 = (row_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (pHVar7 = row_value_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pHVar7 != row_value_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pHVar7 = pHVar7 + 1) {
      *pdVar8 = pHVar7->hi + pHVar7->lo;
      pdVar8 = pdVar8 + 1;
    }
    std::_Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>::~_Vector_base
              (&row_value_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>);
    HVar5 = kOk;
  }
  return HVar5;
}

Assistant:

HighsStatus calculateRowValuesQuad(const HighsLp& lp,
                                   const std::vector<double>& col_value,
                                   std::vector<double>& row_value,
                                   const HighsInt report_row) {
  const bool correct_size = int(col_value.size()) == lp.num_col_;
  const bool is_colwise = lp.a_matrix_.isColwise();
  const bool data_error = !correct_size || !is_colwise;
  assert(!data_error);
  if (data_error) return HighsStatus::kError;

  std::vector<HighsCDouble> row_value_quad;
  row_value_quad.assign(lp.num_row_, HighsCDouble{0.0});

  for (HighsInt col = 0; col < lp.num_col_; col++) {
    for (HighsInt i = lp.a_matrix_.start_[col];
         i < lp.a_matrix_.start_[col + 1]; i++) {
      const HighsInt row = lp.a_matrix_.index_[i];
      assert(row >= 0);
      assert(row < lp.num_row_);
      row_value_quad[row] += col_value[col] * lp.a_matrix_.value_[i];
      if (row == report_row) {
        printf(
            "calculateRowValuesQuad: Row %d becomes %g due to contribution of "
            ".col_value[%d] = %g\n",
            int(row), double(row_value_quad[row]), int(col), col_value[col]);
      }
    }
  }

  // assign quad values to double vector
  row_value.resize(lp.num_row_);
  std::transform(row_value_quad.begin(), row_value_quad.end(),
                 row_value.begin(), [](HighsCDouble x) { return double(x); });

  return HighsStatus::kOk;
}